

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

int mpt_bind(mpt_socket *sd,char *where,mpt_fdmode *mode,int backlog)

{
  bool bVar1;
  bool bVar2;
  mpt_fdmode mVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  socklen_t len;
  mpt_fdmode info;
  socklen_t local_9c;
  undefined1 local_98 [2];
  anon_union_4_2_317a4d69_for_param aStack_96;
  uint16_t uStack_92;
  
  if (where == (char *)0x0) {
    iVar4 = sd->_id;
    if (-1 < iVar4) {
      local_9c = 0x6e;
      iVar5 = getsockname(iVar4,(sockaddr *)local_98,&local_9c);
      if (((-1 < iVar5) && (local_98 == (undefined1  [2])0x1)) && (2 < local_9c)) {
        unlink(local_98 + 2);
      }
      close(iVar4);
      sd->_id = -1;
      return 1;
    }
    return 0;
  }
  if (mode == (mpt_fdmode *)0x0) {
    uVar6 = mpt_mode_parse(local_98,where);
    mVar3 = _local_98;
    if (-1 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
      if (uVar6 == 0) {
        local_98 = (undefined1  [2])(local_98 & 0xff00);
        uStack_92 = mVar3.stream;
        aStack_96 = (anon_union_4_2_317a4d69_for_param)0x1;
        goto LAB_001039aa;
      }
      goto LAB_001039ac;
    }
    piVar7 = __errno_location();
    *piVar7 = 0x16;
LAB_00103ad4:
    uVar6 = 0xffffffff;
  }
  else {
    _local_98 = *mode;
LAB_001039aa:
    uVar8 = 0;
LAB_001039ac:
    iVar4 = (int)uVar8;
    if (local_98[0] < '\0') {
      if (((ulong)_local_98 & 0x10000) == 0) {
        if (((ulong)_local_98 & 0x400000) == 0) {
          bVar1 = false;
        }
        else {
          iVar5 = mkfifo(where,(uint)aStack_96.file.perm);
          if (iVar5 < 0) {
            bVar1 = false;
            bVar2 = false;
            if (local_98[2] < '\0') goto LAB_00103b4c;
          }
          else {
            _local_98 = (mpt_fdmode)((ulong)_local_98 & 0xffffffffff3fffff);
            bVar1 = true;
          }
        }
        iVar4 = open(where + uVar8,(uint)aStack_96.file.open,(ulong)_local_98 >> 0x20 & 0xffff);
        iVar5 = iVar4;
        if (iVar4 < 0) {
          if (bVar1) {
            unlink(where);
          }
          bVar2 = false;
        }
        else {
          _local_98 = (mpt_fdmode)((ulong)_local_98 & 0xffffffff);
          bVar2 = true;
        }
      }
      else {
        piVar7 = __errno_location();
        *piVar7 = 0x16;
        bVar2 = false;
        iVar5 = -1;
      }
LAB_00103b4c:
      if (!bVar2) {
        return iVar5;
      }
    }
    else {
      iVar4 = socketSet(where + uVar8,(mpt_fdmode *)local_98,bind);
      if (iVar4 < 0) {
        return iVar4;
      }
      if (((-1 < backlog) && (uStack_92 == 7)) && (iVar5 = listen(iVar4,backlog), iVar5 < 0)) {
        close(iVar4);
        goto LAB_00103ad4;
      }
    }
    if (-1 < sd->_id) {
      close(sd->_id);
    }
    sd->_id = iVar4;
    uVar6 = (uint)aStack_96.file.perm;
  }
  return uVar6;
}

Assistant:

extern int mpt_bind(MPT_STRUCT(socket) *sd, const char *where, const MPT_STRUCT(fdmode) *mode, int backlog)
{
	MPT_STRUCT(fdmode) info;
	int sock;
	
	if (!where) {
		if ((sock = sd->_id) < 0) {
			return 0;
		}
		(void) socketUnbind(sock);
		(void) close(sock);
		sd->_id = -1;
		return 1;
	}
	/* use mode passed by caller */
	if (mode) {
		info = *mode;
		sock = 0;
	}
	/* detect mode based on prefix */
	else if ((sock = mpt_mode_parse(&info, where)) < 0) {
		errno = EINVAL;
		return -1;
	}
	/* no prefix detected: default to IP socket */
	else if (!sock) {
		info.family = AF_UNSPEC;
		info.param.sock.type = SOCK_STREAM;
		info.param.sock.proto = 0;
		info.param.sock.port = 0;
	}
	/* open as normal file */
	if (info.family < 0) {
		int res = -1;
		if (info.param.file.open & O_WRONLY) {
			errno = EINVAL;
			return -1;
		}
		if (info.param.file.open & O_CREAT) {
			if ((res = mkfifo(where, info.param.file.perm)) >= 0) {
				info.param.file.open &= ~(O_EXCL | O_CREAT);
			}
			else if (info.param.file.open & O_EXCL) {
				return res;
			}
		}
		if ((sock = open(where + sock, info.param.file.open, info.param.file.perm)) < 0) {
			if (res >= 0) {
				unlink(where);
			}
			return sock;
		}
		info.stream = 0;
		info.param.sock.port = 0;
	}
	/* bind socket to address */
	else if ((sock = socketSet(where + sock, &info, bind)) < 0) {
		return sock;
	}
	/* require listening state */
	else if ((info.stream == (MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write) | MPT_SOCKETFLAG(Stream)))
	    && (backlog >= 0)
	    && listen(sock, backlog) < 0) {
		(void) close(sock);
		return -1;
	}
	if (sd->_id >= 0) {
		(void) close(sd->_id);
	}
	sd->_id = sock;
	
	return info.param.sock.port;
}